

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  undefined1 auVar1 [64];
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  stbi_uc *psVar10;
  long lVar11;
  stbi__uint16 *psVar12;
  undefined1 auVar13 [64];
  undefined1 in_ZMM0 [64];
  
  iVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    for (lVar11 = 0; (int)lVar11 < count[lVar5]; lVar11 = lVar11 + 1) {
      h->size[lVar11 + iVar6] = (char)lVar5 + '\x01';
    }
    iVar6 = iVar6 + (int)lVar11;
  }
  uVar4 = 0;
  h->size[iVar6] = '\0';
  uVar7 = 1;
  iVar6 = 0;
  do {
    if (uVar7 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      auVar13 = vpternlogd_avx512f(in_ZMM0,in_ZMM0,in_ZMM0,0xff);
      uVar7 = 0;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])h->fast = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0x40) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0x80) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0xc0) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0x100) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0x140) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0x180) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])(h->fast + 0x1c0) = auVar1;
      for (; uVar7 != (~((int)uVar4 >> 0x1f) & uVar4); uVar7 = uVar7 + 1) {
        if ((ulong)h->size[uVar7] < 10) {
          uVar3 = h->code[uVar7];
          uVar8 = 9 - (ulong)h->size[uVar7];
          for (lVar5 = 0; (uint)lVar5 >> ((uint)uVar8 & 0x1f) == 0; lVar5 = lVar5 + 1) {
            h->fast[lVar5 + ((ulong)uVar3 << (uVar8 & 0x3f))] = (stbi_uc)uVar7;
          }
        }
      }
      return 1;
    }
    h->delta[uVar7] = uVar4 - iVar6;
    uVar8 = (ulong)h->size[(int)uVar4];
    if (uVar7 == uVar8) {
      psVar12 = h->code + (int)uVar4;
      psVar10 = h->size + (long)(int)uVar4 + 1;
      while (uVar7 == uVar8) {
        *psVar12 = (stbi__uint16)iVar6;
        iVar6 = iVar6 + 1;
        uVar4 = uVar4 + 1;
        psVar12 = psVar12 + 1;
        bVar2 = *psVar10;
        psVar10 = psVar10 + 1;
        uVar8 = (ulong)bVar2;
      }
      if (iVar6 - 1U >> ((uint)uVar7 & 0x1f) != 0) {
        stbi__g_failure_reason = "bad code lengths";
        return 0;
      }
    }
    uVar9 = iVar6 << ((byte)(0x10 - (char)uVar7) & 0x1f);
    iVar6 = iVar6 * 2;
    h->maxcode[uVar7] = uVar9;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}